

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_protocol.cpp
# Opt level: O3

bool __thiscall
udpdiscovery::Packet::Serialize
          (Packet *this,ProtocolVersion protocol_version,SerializeDirection direction,
          BufferView *buffer_view)

{
  bool bVar1;
  uint uVar2;
  SerializeDirection direction_00;
  int iVar3;
  uint16_t user_data_size;
  uint16_t padding_size;
  uint8_t reserved;
  ushort local_3e;
  unsigned_short local_3c;
  uchar local_39;
  Packet *local_38;
  
  if (direction == kSerialize) {
    if ((protocol_version != kProtocolVersion0) && (protocol_version != kProtocolVersion1)) {
      return false;
    }
    local_38 = this;
    std::__cxx11::string::push_back((char)buffer_view->buffer_);
    std::__cxx11::string::push_back((char)buffer_view->buffer_);
    std::__cxx11::string::push_back((char)buffer_view->buffer_);
    std::__cxx11::string::push_back((char)buffer_view->buffer_);
    std::__cxx11::string::push_back((char)buffer_view->buffer_);
    this = local_38;
  }
  local_39 = '\0';
  iVar3 = 3;
  do {
    bVar1 = impl::SerializeUnsignedIntegerBigEndian<unsigned_char>(direction,&local_39,buffer_view);
    if (!bVar1) {
      return false;
    }
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  bVar1 = impl::SerializeUnsignedIntegerBigEndian<unsigned_char>
                    (direction,&this->packet_type_,buffer_view);
  if (!bVar1) {
    return false;
  }
  direction_00 = direction;
  if (direction == kParse) {
    if (1 < this->packet_type_) {
      return false;
    }
    direction_00 = kParse;
  }
  bVar1 = impl::SerializeUnsignedIntegerBigEndian<unsigned_int>
                    (direction_00,&this->application_id_,buffer_view);
  if (!bVar1) {
    return false;
  }
  bVar1 = impl::SerializeUnsignedIntegerBigEndian<unsigned_int>
                    (direction,&this->peer_id_,buffer_view);
  if (!bVar1) {
    return false;
  }
  bVar1 = impl::SerializeUnsignedIntegerBigEndian<unsigned_long>
                    (direction,&this->snapshot_index_,buffer_view);
  if (!bVar1) {
    return false;
  }
  local_3e = (ushort)(this->user_data_)._M_string_length;
  bVar1 = impl::SerializeUnsignedIntegerBigEndian<unsigned_short>(direction,&local_3e,buffer_view);
  if (!bVar1) {
    return false;
  }
  if (direction == kParse) {
    if (protocol_version == kProtocolVersion0) {
      if (0x8000 < local_3e) {
        return false;
      }
      goto LAB_0010247c;
    }
    uVar2 = 0;
    if (protocol_version == kProtocolVersion1 && 0x1000 < local_3e) {
      return false;
    }
    local_3c = 0;
  }
  else {
    local_3c = 0;
    if (protocol_version != kProtocolVersion0) goto LAB_001024c4;
LAB_0010247c:
    local_3c = 0;
    bVar1 = impl::SerializeUnsignedIntegerBigEndian<unsigned_short>(direction,&local_3c,buffer_view)
    ;
    uVar2 = (uint)local_3c;
    if (0x8000 < local_3c || !bVar1) {
      return false;
    }
    if (direction != kParse) goto LAB_001024c4;
  }
  if ((int)buffer_view->buffer_->_M_string_length - buffer_view->parsed_ != uVar2 + local_3e) {
    return false;
  }
  direction = kParse;
LAB_001024c4:
  bVar1 = impl::SerializeString(direction,&this->user_data_,(uint)local_3e,buffer_view);
  return bVar1;
}

Assistant:

bool Packet::Serialize(ProtocolVersion protocol_version,
                       impl::SerializeDirection direction,
                       impl::BufferView* buffer_view) {
  if (direction == impl::kSerialize) {
    if (protocol_version == kProtocolVersion0) {
      buffer_view->push_back('R');
      buffer_view->push_back('N');
      buffer_view->push_back('6');
      buffer_view->push_back('U');
    } else if (protocol_version == kProtocolVersion1) {
      buffer_view->push_back('S');
      buffer_view->push_back('O');
      buffer_view->push_back('7');
      buffer_view->push_back('V');
    } else {
      return false;
    }

    uint8_t version = protocol_version;
    impl::SerializeUnsignedIntegerBigEndian(impl::kSerialize, &version,
                                            buffer_view);
  }

  uint8_t reserved = 0;
  for (int i = 0; i < 3; ++i) {
    if (!impl::SerializeUnsignedIntegerBigEndian(direction, &reserved,
                                                 buffer_view)) {
      return false;
    }
  }

  if (!impl::SerializeUnsignedIntegerBigEndian(direction, &packet_type_,
                                               buffer_view)) {
    return false;
  }

  if (direction == impl::kParse) {
    if (impl::GetPacketType(packet_type_) == kPacketTypeUnknown) {
      return false;
    }
  }

  if (!impl::SerializeUnsignedIntegerBigEndian(direction, &application_id_,
                                               buffer_view)) {
    return false;
  }

  if (!impl::SerializeUnsignedIntegerBigEndian(direction, &peer_id_,
                                               buffer_view)) {
    return false;
  }

  if (!impl::SerializeUnsignedIntegerBigEndian(direction, &snapshot_index_,
                                               buffer_view)) {
    return false;
  }

  uint16_t user_data_size = (uint16_t)user_data_.size();
  if (!impl::SerializeUnsignedIntegerBigEndian(direction, &user_data_size,
                                               buffer_view)) {
    return false;
  }

  if (direction == impl::kParse) {
    if (protocol_version == kProtocolVersion0) {
      if (user_data_size > kMaxUserDataSizeV0) {
        return false;
      }
    } else if (protocol_version == kProtocolVersion1) {
      if (user_data_size > kMaxUserDataSizeV1) {
        return false;
      }
    }
  }

  uint16_t padding_size = 0;
  if (protocol_version == kProtocolVersion0) {
    if (!impl::SerializeUnsignedIntegerBigEndian(direction, &padding_size,
                                                 buffer_view)) {
      return false;
    }

    if (padding_size > kMaxPaddingSizeV0) {
      return false;
    }
  }

  // End of serializing header.

  if (direction == impl::kParse) {
    if (buffer_view->LeftUnparsed() != user_data_size + padding_size) {
      return false;
    }
  }

  if (!impl::SerializeString(direction, &user_data_, user_data_size,
                             buffer_view)) {
    return false;
  }

  // Do not serialize padding even for protocol version 0.

  return true;
}